

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapass.cpp
# Opt level: O1

Error __thiscall asmjit::v1_14::BaseRAPass::_updateStackArgs(BaseRAPass *this)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  FuncNode *pFVar4;
  long lVar5;
  long lVar6;
  undefined1 *puVar7;
  uint32_t uVar8;
  int iVar9;
  ulong uVar10;
  
  uVar3 = *(uint *)&this->field_0x148;
  if ((ulong)uVar3 != 0) {
    pFVar4 = this->_func;
    lVar5 = *(long *)&this->_workRegs;
    uVar8 = (this->_fp).super_Operand.super_Operand_._baseId;
    uVar10 = 0;
    do {
      lVar6 = *(long *)(lVar5 + uVar10 * 8);
      if ((*(byte *)(lVar6 + 0x25) & 4) != 0) {
        bVar1 = *(byte *)(lVar6 + 0x48);
        if (bVar1 == 0xff) {
          _updateStackArgs();
LAB_0012a9dd:
          _updateStackArgs();
LAB_0012a9e2:
          _updateStackArgs();
LAB_0012a9e7:
          _updateStackArgs();
          return 3;
        }
        puVar7 = *(undefined1 **)(lVar6 + 0x18);
        if (puVar7 == (undefined1 *)0x0) {
          return 3;
        }
        if ((puVar7[2] & 2) == 0) {
          if (0x1f < bVar1) goto LAB_0012a9dd;
          bVar2 = *(byte *)(lVar6 + 0x49);
          if (3 < bVar2) goto LAB_0012a9e7;
          (&this->_fp)[(ulong)bVar1 + 4].super_Operand.super_Operand_._data[(ulong)bVar2 - 1] =
               (&this->_fp)[(ulong)bVar1 + 4].super_Operand.super_Operand_._data[(ulong)bVar2 - 1] &
               0xfff | *(int *)(puVar7 + 0x10) << 0xc;
        }
        else {
          if (0x1f < bVar1) goto LAB_0012a9e2;
          if (((pFVar4->_frame)._attributes & kHasPreservedFP) == kNoAttributes) {
            iVar9 = (*(int *)(&pFVar4->field_0xd0 + (ulong)bVar1 * 0x10) >> 0xc) +
                    (pFVar4->_frame)._saOffsetFromSP;
          }
          else {
            *puVar7 = (char)uVar8;
            iVar9 = (*(int *)(&pFVar4->field_0xd0 + (ulong)bVar1 * 0x10) >> 0xc) +
                    (pFVar4->_frame)._saOffsetFromSA;
          }
          *(int *)(puVar7 + 0x10) = iVar9;
        }
        if (puVar7 == (undefined1 *)0x0) {
          return 3;
        }
      }
      uVar10 = uVar10 + 1;
    } while (uVar3 != uVar10);
  }
  return 0;
}

Assistant:

Error BaseRAPass::_updateStackArgs() noexcept {
  FuncFrame& frame = func()->frame();
  RAWorkRegs& workRegs = _workRegs;
  uint32_t numWorkRegs = workRegCount();

  for (uint32_t workId = 0; workId < numWorkRegs; workId++) {
    RAWorkReg* workReg = workRegs[workId];
    if (workReg->hasFlag(RAWorkRegFlags::kStackArgToStack)) {
      ASMJIT_ASSERT(workReg->hasArgIndex());
      RAStackSlot* slot = workReg->stackSlot();

      if (ASMJIT_UNLIKELY(!slot))
        return DebugUtils::errored(kErrorInvalidState);

      if (slot->isStackArg()) {
        const FuncValue& srcArg = _func->detail().arg(workReg->argIndex());
        if (frame.hasPreservedFP()) {
          slot->setBaseRegId(_fp.id());
          slot->setOffset(int32_t(frame.saOffsetFromSA()) + srcArg.stackOffset());
        }
        else {
          slot->setOffset(int32_t(frame.saOffsetFromSP()) + srcArg.stackOffset());
        }
      }
      else {
        FuncValue& dstArg = _argsAssignment.arg(workReg->argIndex(), workReg->argValueIndex());
        dstArg.setStackOffset(slot->offset());
      }
    }
  }

  return kErrorOk;
}